

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O3

void anon_unknown.dwarf_8d25b::getEdgePoints<double>
               (vector<double,_std::allocator<double>_> *edge,
               vector<int,_std::allocator<int>_> *data,vector<int,_std::allocator<int>_> *first,
               vector<int,_std::allocator<int>_> *second,EdgeParameter *edgeParameter)

{
  bool checkContrast;
  pointer piVar1;
  bool bVar2;
  uint32_t size;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint32_t position;
  uint32_t leftSideOffset;
  ulong uVar6;
  int minimumContrast;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  vector<int,_std::allocator<int>_> *second_00;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint32_t leftSideOffset_00;
  ulong uVar16;
  int iVar15;
  
  size = (uint32_t)
         ((ulong)((long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2);
  if (1 < size - 2) {
    checkContrast =
         edgeParameter->contrastCheckLeftSideOffset != 0 &&
         edgeParameter->contrastCheckRightSideOffset != 0;
    uVar16 = 2;
    minimumContrast = (uint)edgeParameter->minimumContrast * edgeParameter->groupFactor;
    uVar8 = 1;
    do {
      second_00 = (vector<int,_std::allocator<int>_> *)
                  (second->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      uVar11 = uVar8 + 1;
      if ((-1 < *(int *)((long)&(second_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + uVar8 * 4)) &&
         (*(int *)((long)&(second_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + uVar8 * 4 + 4) < 1)) {
        piVar1 = (first->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = piVar1[uVar11];
        if (piVar1[uVar11] < piVar1[uVar8]) {
          uVar7 = piVar1[uVar8];
        }
        if (0 < (int)uVar7) {
          uVar13 = uVar7 / 3;
          if (uVar7 < 3) {
            uVar13 = 1;
          }
          iVar10 = piVar1[uVar8 & 0xffffffff];
          uVar12 = uVar7 >> 1;
          if (uVar7 == 1) {
            uVar12 = 1;
          }
          bVar5 = iVar10 < (int)uVar12;
          bVar2 = iVar10 < (int)uVar13;
          position = (uint32_t)uVar8;
          leftSideOffset = position;
          leftSideOffset_00 = position;
          if ((int)uVar13 <= iVar10) {
            uVar6 = uVar8 & 0xffffffff;
            uVar8 = uVar8 & 0xffffffff;
            bVar5 = iVar10 < (int)uVar12;
            do {
              iVar15 = (int)uVar8;
              leftSideOffset_00 = iVar15 - 1;
              uVar8 = (ulong)leftSideOffset_00;
              if (((int)uVar7 < iVar10) || (iVar15 == 0)) {
                leftSideOffset = (uint32_t)uVar6;
                leftSideOffset_00 = position;
                if (!(bool)(bVar5 | bVar2)) goto LAB_001136ce;
                break;
              }
              iVar10 = piVar1[uVar8];
              uVar14 = uVar6;
              bVar2 = bVar5;
              if (iVar10 < (int)uVar12) {
                bVar2 = true;
                uVar14 = (ulong)leftSideOffset_00;
              }
              if (!bVar5) {
                uVar6 = uVar14;
                bVar5 = bVar2;
              }
              bVar2 = iVar10 < (int)uVar13;
              leftSideOffset = (uint32_t)uVar6;
            } while ((int)uVar13 <= iVar10);
          }
          if (uVar11 < size - 1) {
            bVar3 = false;
            uVar8 = uVar16;
            uVar6 = uVar11;
            do {
              iVar10 = piVar1[uVar8];
              uVar14 = uVar6;
              bVar4 = bVar3;
              if (iVar10 < (int)uVar12) {
                uVar14 = uVar8;
                bVar4 = true;
              }
              if (bVar3) {
                uVar14 = uVar6;
                bVar4 = bVar3;
              }
              bVar3 = bVar4;
              uVar6 = uVar14 & 0xffffffff;
              uVar9 = uVar8;
            } while ((((int)uVar13 <= iVar10) && (uVar9 = uVar11, iVar10 <= (int)uVar7)) &&
                    (uVar8 = uVar8 + 1, uVar8 < size - 1));
            if ((bool)(bVar5 & bVar3)) {
              bVar5 = findPoint<double>((vector<int,_std::allocator<int>_> *)
                                        (data->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_start,second_00,edge,
                                        leftSideOffset,(uint32_t)uVar14,minimumContrast,
                                        checkContrast,edgeParameter->contrastCheckLeftSideOffset,
                                        edgeParameter->contrastCheckRightSideOffset,position,size);
              if ((iVar10 < (int)uVar13) && ((!bVar5 && (!(bool)(bVar2 ^ 1))))) {
                second_00 = (vector<int,_std::allocator<int>_> *)
                            (second->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start;
LAB_001138dc:
                findPoint<double>((vector<int,_std::allocator<int>_> *)
                                  (data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start,second_00,edge,leftSideOffset_00,
                                  (uint32_t)uVar9,minimumContrast,checkContrast,
                                  edgeParameter->contrastCheckLeftSideOffset,
                                  edgeParameter->contrastCheckRightSideOffset,position,size);
              }
            }
            else if ((iVar10 < (int)uVar13) && (!(bool)(bVar2 ^ 1))) goto LAB_001138dc;
          }
        }
      }
LAB_001136ce:
      uVar16 = uVar16 + 1;
      uVar8 = uVar11;
    } while (uVar11 != size - 2);
  }
  return;
}

Assistant:

void getEdgePoints( std::vector < _Type > & edge, const std::vector < int > & data, const std::vector < int > & first, const std::vector < int > & second, const EdgeParameter & edgeParameter )
    {
        const uint32_t dataSize = static_cast<uint32_t>(data.size()); // we know that initial size is uint32_t
        const int minimumContrast = static_cast<int>(edgeParameter.minimumContrast * edgeParameter.groupFactor);

        const bool checkContrast = (edgeParameter.contrastCheckLeftSideOffset > 0u) && (edgeParameter.contrastCheckRightSideOffset > 0u);

        for ( uint32_t i = 1u; i < dataSize - 2u; i++ ) {
            if ( second[i] < 0 || second[i + 1] > 0 )
                continue;

            const int maxGradient = (first[i] > first[i + 1]) ? first[i] : first[i + 1];

            if ( maxGradient <= 0 )
                continue;

            const int minGradientValue = (maxGradient < 3) ? 1 : maxGradient / 3;
            const int halfGradient     = (maxGradient < 2) ? 1 : maxGradient / 2;

            // left side
            bool normalGradientleftEdgeFound  = false;
            bool minimumGradientLeftEdgeFound = false;

            uint32_t normalLeftSide  = i;
            uint32_t minimumLeftSide = i;

            for ( uint32_t j = i; ; --j ) {
                if ( !normalGradientleftEdgeFound && first[j] < halfGradient ) {
                    normalLeftSide = j;
                    normalGradientleftEdgeFound = true;
                }

                if ( first[j] < minGradientValue ) {
                    minimumLeftSide = j;
                    minimumGradientLeftEdgeFound = true;
                    break;
                }

                if ( first[j] > maxGradient )
                    break;

                if ( j == 0u ) // this is to avoid out of bounds situation
                    break;
            }

            if ( !normalGradientleftEdgeFound && !minimumGradientLeftEdgeFound )
                continue;

            // right side
            bool normalGradientRightEdgeFound  = false;
            bool minimumGradientRightEdgeFound = false;

            uint32_t normalRightSide  = i + 1u;
            uint32_t minimumRightSide = i + 1u;

            for ( uint32_t j = i + 1u; j < dataSize - 1u; ++j ) {
                if ( !normalGradientRightEdgeFound && first[j] < halfGradient ) {
                    normalRightSide = j;
                    normalGradientRightEdgeFound = true;
                }

                if ( first[j] < minGradientValue ) {
                    minimumRightSide = j;
                    minimumGradientRightEdgeFound = true;
                    break;
                }

                if ( first[j] > maxGradient )
                    break;
            }

            bool edgeFound = false;

            if ( normalGradientleftEdgeFound && normalGradientRightEdgeFound ) {
                edgeFound = findPoint( data, second, edge, normalLeftSide, normalRightSide, minimumContrast, checkContrast,
                                       edgeParameter.contrastCheckLeftSideOffset, edgeParameter.contrastCheckRightSideOffset,
                                       i, dataSize );
            }

            if ( !edgeFound && minimumGradientLeftEdgeFound && minimumGradientRightEdgeFound ) {
                findPoint( data, second, edge, minimumLeftSide, minimumRightSide, minimumContrast, checkContrast,
                           edgeParameter.contrastCheckLeftSideOffset, edgeParameter.contrastCheckRightSideOffset,
                           i, dataSize );
            }
        }
    }